

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gls::(anonymous_namespace)::generateTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,AttribType *type,int arraySize
          )

{
  long lVar1;
  long *plVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar3;
  undefined4 in_register_0000000c;
  size_type *psVar4;
  int iVar5;
  string *local_1d8;
  long local_1d0;
  string local_1c8;
  undefined1 local_1a8 [128];
  ios_base local_128 [264];
  
  iVar5 = (int)type;
  if (iVar5 == -1) {
    local_1d8 = &local_1c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d8,"","",CONCAT44(in_register_0000000c,arraySize));
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 0x10));
    std::ostream::operator<<((ostringstream *)(local_1a8 + 0x10),iVar5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 0x10));
    std::ios_base::~ios_base(local_128);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_1c8.field_2,0,(char *)0x0,0xaee801)
    ;
    local_1d8 = &local_1c8;
    psVar3 = (string *)(plVar2 + 2);
    if ((string *)*plVar2 == psVar3) {
      local_1c8._M_dataplus._M_p = (psVar3->_M_dataplus)._M_p;
      local_1c8._M_string_length = plVar2[3];
    }
    else {
      local_1c8._M_dataplus._M_p = (psVar3->_M_dataplus)._M_p;
      local_1d8 = (string *)*plVar2;
    }
    local_1d0 = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
  }
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,*(ulong *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  psVar3 = &local_1c8;
  if (local_1d8 != psVar3) {
    operator_delete(local_1d8,(ulong)(local_1c8._M_dataplus._M_p + 1));
    psVar3 = extraout_RAX;
  }
  if (iVar5 != -1) {
    psVar3 = (string *)local_1a8;
    if ((string *)local_1c8.field_2._M_allocated_capacity != psVar3) {
      operator_delete((void *)local_1c8.field_2._M_allocated_capacity,(ulong)(local_1a8._0_8_ + 1));
      psVar3 = extraout_RAX_00;
    }
  }
  return psVar3;
}

Assistant:

string generateTestName (const AttribType& type, int arraySize)
{
	return type.getName() + (arraySize != Attribute::NOT_ARRAY ? "_array_" + de::toString(arraySize) : "");
}